

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void flatbuffers::tests::anon_unknown_0::UninitializedVectorTest(void)

{
  int8_t iVar1;
  int16_t iVar2;
  Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_> test4;
  Offset<MyGame::Example::Monster> root;
  size_t buffer_minalign;
  uint8_t *buf_00;
  Monster *this;
  Vector<const_MyGame::Example::Test_*,_unsigned_int> *this_00;
  return_type this_01;
  return_type this_02;
  return_type test_1;
  return_type test_0;
  Vector<const_MyGame::Example::Test_*,_unsigned_int> *vec;
  Monster *uvt;
  uint8_t *p;
  undefined1 local_c0 [8];
  MonsterBuilder monster_builder;
  Offset<flatbuffers::String> required_name;
  Test *pTStack_90;
  Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_> vector_offset;
  Test *buf;
  FlatBufferBuilder builder;
  
  buffer_minalign = AlignOf<unsigned_long>();
  FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<false> *)&buf,0x400,(Allocator *)0x0,false,buffer_minalign);
  pTStack_90 = (Test *)0x0;
  test4 = FlatBufferBuilderImpl<false>::CreateUninitializedVectorOfStructs<MyGame::Example::Test>
                    ((FlatBufferBuilderImpl<false> *)&buf,2,&stack0xffffffffffffff70);
  TestEq<bool,bool>(true,pTStack_90 != (Test *)0x0,"\'nullptr\' == \'buf\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x19b,"");
  MyGame::Example::Test::Test((Test *)&required_name,10,'\x14');
  pTStack_90->a_ = (undefined2)required_name.o;
  pTStack_90->b_ = required_name.o._2_1_;
  pTStack_90->padding0__ = required_name.o._3_1_;
  MyGame::Example::Test::Test((Test *)&monster_builder.field_0xc,0x1e,'(');
  pTStack_90[1].a_ = monster_builder._12_2_;
  pTStack_90[1].b_ = monster_builder._14_1_;
  pTStack_90[1].padding0__ = monster_builder._15_1_;
  monster_builder.start_ =
       (uoffset_t)
       FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                 ((FlatBufferBuilderImpl<false> *)&buf,"myMonster");
  MyGame::Example::MonsterBuilder::MonsterBuilder
            ((MonsterBuilder *)local_c0,(FlatBufferBuilder *)&buf);
  MyGame::Example::MonsterBuilder::add_name
            ((MonsterBuilder *)local_c0,(Offset<flatbuffers::String>)monster_builder.start_);
  MyGame::Example::MonsterBuilder::add_test4((MonsterBuilder *)local_c0,test4);
  root = MyGame::Example::MonsterBuilder::Finish((MonsterBuilder *)local_c0);
  FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
            ((FlatBufferBuilderImpl<false> *)&buf,root,(char *)0x0);
  buf_00 = FlatBufferBuilderImpl<false>::GetBufferPointer((FlatBufferBuilderImpl<false> *)&buf);
  this = GetRoot<MyGame::Example::Monster>(buf_00);
  TestEq<bool,bool>(true,this != (Monster *)0x0,"\'nullptr\' == \'uvt\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x1a8,"");
  this_00 = MyGame::Example::Monster::test4(this);
  TestEq<bool,bool>(true,this_00 != (Vector<const_MyGame::Example::Test_*,_unsigned_int> *)0x0,
                    "\'nullptr\' == \'vec\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x1aa,"");
  this_01 = Vector<const_MyGame::Example::Test_*,_unsigned_int>::Get(this_00,0);
  this_02 = Vector<const_MyGame::Example::Test_*,_unsigned_int>::Get(this_00,1);
  iVar2 = MyGame::Example::Test::a(this_01);
  TestEq<short,int>(iVar2,10,"\'test_0->a()\' != \'10\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x1ad,"");
  iVar1 = MyGame::Example::Test::b(this_01);
  TestEq<signed_char,int>
            (iVar1,0x14,"\'test_0->b()\' != \'20\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
             ,0x1ae,"");
  iVar2 = MyGame::Example::Test::a(this_02);
  TestEq<short,int>(iVar2,0x1e,"\'test_1->a()\' != \'30\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x1af,"");
  iVar1 = MyGame::Example::Test::b(this_02);
  TestEq<signed_char,int>
            (iVar1,0x28,"\'test_1->b()\' != \'40\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
             ,0x1b0,"");
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl((FlatBufferBuilderImpl<false> *)&buf);
  return;
}

Assistant:

void UninitializedVectorTest() {
  flatbuffers::FlatBufferBuilder builder;

  Test *buf = nullptr;
  auto vector_offset =
      builder.CreateUninitializedVectorOfStructs<Test>(2, &buf);
  TEST_NOTNULL(buf);
  buf[0] = Test(10, 20);
  buf[1] = Test(30, 40);

  auto required_name = builder.CreateString("myMonster");
  auto monster_builder = MonsterBuilder(builder);
  monster_builder.add_name(
      required_name);  // required field mandated for monster.
  monster_builder.add_test4(vector_offset);
  builder.Finish(monster_builder.Finish());

  auto p = builder.GetBufferPointer();
  auto uvt = flatbuffers::GetRoot<Monster>(p);
  TEST_NOTNULL(uvt);
  auto vec = uvt->test4();
  TEST_NOTNULL(vec);
  auto test_0 = vec->Get(0);
  auto test_1 = vec->Get(1);
  TEST_EQ(test_0->a(), 10);
  TEST_EQ(test_0->b(), 20);
  TEST_EQ(test_1->a(), 30);
  TEST_EQ(test_1->b(), 40);
}